

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_helper.cxx
# Opt level: O3

bool __thiscall batch_helper::prepare_target_name(batch_helper *this,cl_parser *cl)

{
  string *value;
  bool bVar1;
  int iVar2;
  char *format;
  
  value = &this->m_output_folder;
  bVar1 = cl_parser::get_string(cl,"-dir",value);
  if (bVar1) {
    bVar1 = xray_re::xr_file_system::folder_exist((value->_M_dataplus)._M_p);
    if (!bVar1) {
      if ((xray_re::xr_file_system::instance()::instance0 == '\0') &&
         (iVar2 = __cxa_guard_acquire(&xray_re::xr_file_system::instance()::instance0), iVar2 != 0))
      {
        xray_re::xr_file_system::xr_file_system(&xray_re::xr_file_system::instance::instance0);
        __cxa_atexit(xray_re::xr_file_system::~xr_file_system,
                     &xray_re::xr_file_system::instance::instance0,&__dso_handle);
        __cxa_guard_release(&xray_re::xr_file_system::instance()::instance0);
      }
      bVar1 = xray_re::xr_file_system::create_folder
                        (&xray_re::xr_file_system::instance::instance0,(value->_M_dataplus)._M_p);
      if (!bVar1) {
        format = "output folder does not exist";
        goto LAB_0011ee63;
      }
    }
    xray_re::xr_file_system::append_path_separator(value);
    bVar1 = true;
  }
  else {
    bVar1 = cl_parser::get_string(cl,"-out",&this->m_output_file);
    if (!bVar1) {
      return true;
    }
    if (cl->m_num_params < 2) {
      return true;
    }
    format = "explicitly specified output file expects single input file";
LAB_0011ee63:
    bVar1 = false;
    xray_re::msg(format);
  }
  return bVar1;
}

Assistant:

bool batch_helper::prepare_target_name(const cl_parser& cl)
{
	if (cl.get_string("-dir", m_output_folder)) {
		if (!xr_file_system::folder_exist(m_output_folder) && !xr_file_system::instance().create_folder(m_output_folder)) {
			msg("output folder does not exist");
			return false;
		}
		xr_file_system::append_path_separator(m_output_folder);
	} else if (cl.get_string("-out", m_output_file)) {
		if (cl.num_params() > 1) {
			msg("explicitly specified output file expects single input file");
			return false;
		}
	}
	return true;
}